

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O2

lu_byte luaO_codeparam(uint p)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar2 = 0xff;
  if (p < 0x60e00) {
    uVar3 = p << 7 | 0x60;
    uVar2 = (ulong)uVar3 / 100;
    if (0x63f < uVar3) {
      bVar1 = luaO_ceillog2((uint)uVar2 + 1);
      uVar2 = (ulong)((uint)bVar1 * 0x10 + 0xc0 | ((uint)uVar2 >> (bVar1 - 5 & 0x1f)) + 0xf0);
    }
  }
  return (lu_byte)uVar2;
}

Assistant:

lu_byte luaO_codeparam (unsigned int p) {
  if (p >= (cast(lu_mem, 0x1F) << (0xF - 7 - 1)) * 100u)  /* overflow? */
    return 0xFF;  /* return maximum value */
  else {
    p = (cast(l_uint32, p) * 128 + 99) / 100;  /* round up the division */
    if (p < 0x10) {  /* subnormal number? */
      /* exponent bits are already zero; nothing else to do */
      return cast_byte(p);
    }
    else {  /* p >= 0x10 implies ceil(log2(p + 1)) >= 5 */
      /* preserve 5 bits in 'p' */
      unsigned log = luaO_ceillog2(p + 1) - 5u;
      return cast_byte(((p >> log) - 0x10) | ((log + 1) << 4));
    }
  }
}